

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int GetHealthRequestRPLIDAR(RPLIDAR *pRPLIDAR,BOOL *pbProtectionStop)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  char *__s;
  uint uVar4;
  uchar databuf [3];
  uchar reqbuf [2];
  int DataType;
  int DataResponseLength;
  int SendMode;
  char local_32 [4];
  undefined2 local_2e;
  int local_2c;
  int local_28 [2];
  
  local_2e = 0x52a5;
  uVar4 = 0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_2c = 0;
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_2e + (ulong)uVar4),(long)(int)(2 - uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001aa542;
      uVar4 = uVar4 + (int)sVar2;
    } while ((int)uVar4 < 2);
  }
  else {
    if (iVar1 != 0) {
LAB_001aa542:
      puts("Error writing data to a RPLIDAR. ");
      return 1;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_2e + (ulong)uVar4),(ulong)(2 - uVar4));
      if ((int)sVar2 < 1) goto LAB_001aa542;
      uVar4 = uVar4 + (int)sVar2;
    } while (uVar4 < 2);
  }
  iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,local_28,local_28 + 1,&local_2c);
  iVar3 = 1;
  if (iVar1 != 0) {
    return 1;
  }
  if ((local_28[0] == 3) && (local_2c == 6)) {
    local_32[2] = 0;
    local_32[0] = '\0';
    local_32[1] = '\0';
    iVar1 = (pRPLIDAR->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pRPLIDAR->RS232Port).s;
      uVar4 = 0;
      do {
        sVar2 = recv(iVar1,local_32 + uVar4,(long)(int)(3 - uVar4),0);
        if ((int)sVar2 < 1) goto LAB_001aa5ac;
        uVar4 = uVar4 + (int)sVar2;
      } while ((int)uVar4 < 3);
    }
    else {
      if (iVar1 != 0) {
LAB_001aa5ac:
        __s = "A RPLIDAR is not responding correctly. ";
        goto LAB_001aa5b3;
      }
      iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
      uVar4 = 0;
      do {
        sVar2 = read(iVar1,local_32 + uVar4,(ulong)(3 - uVar4));
        if ((int)sVar2 < 1) goto LAB_001aa5ac;
        uVar4 = uVar4 + (int)sVar2;
      } while (uVar4 < 3);
    }
    *pbProtectionStop = (uint)(local_32[0] == '\x02');
    iVar3 = 0;
  }
  else {
    __s = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
LAB_001aa5b3:
    puts(__s);
  }
  return iVar3;
}

Assistant:

inline int GetHealthRequestRPLIDAR(RPLIDAR* pRPLIDAR, BOOL* pbProtectionStop)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
    sl_lidar_response_device_health_t healthinfo;

	if (SL_IS_FAIL(pRPLIDAR->drv->getHealth(healthinfo)))
	{
		printf("A RPLIDAR is not responding correctly : getHealth() failed. \n");
		return EXIT_FAILURE;
	}

	// Analyze the data response.
	*pbProtectionStop = (healthinfo.status == SL_LIDAR_STATUS_ERROR)? TRUE: FALSE;
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,GET_HEALTH_REQUEST_RPLIDAR};
	unsigned char databuf[3];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != 3)||(DataType != DEVHEALTH_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	{ 
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze the data response.
	*pbProtectionStop = (databuf[0] == STATUS_ERROR_RPLIDAR)? TRUE: FALSE;
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}